

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_version.c
# Opt level: O3

IV_API_CALL_STATUS_T ihevcd_get_version(CHAR *pc_version_string,UWORD32 u4_version_buffer_size)

{
  uint uVar1;
  size_t sVar2;
  CHAR ac_version_tmp [512];
  
  snprintf(ac_version_tmp,0x1ff,"@(#)Id:%s_%s Ver:%s Released by %s Build: %s @ %s","HEVCDEC",
           "production","05.00","ITTIAM","May  2 2025","22:22:33");
  sVar2 = strnlen(ac_version_tmp,0x1ff);
  uVar1 = (int)sVar2 + 1;
  if (u4_version_buffer_size >= uVar1) {
    memcpy(pc_version_string,ac_version_tmp,(ulong)uVar1);
  }
  return (uint)(u4_version_buffer_size < uVar1);
}

Assistant:

IV_API_CALL_STATUS_T ihevcd_get_version(CHAR *pc_version_string,
                                        UWORD32 u4_version_buffer_size)
{
    CHAR ac_version_tmp[MAXVERSION_STRLEN + 1];
    UWORD32 u4_len;
    VERSION(ac_version_tmp, CODEC_NAME, CODEC_RELEASE_TYPE, CODEC_RELEASE_VER, CODEC_VENDOR);
    u4_len = strnlen(ac_version_tmp, MAXVERSION_STRLEN) + 1;
    if(u4_version_buffer_size >= u4_len)
    {
        memcpy(pc_version_string, ac_version_tmp, u4_len);
        return IV_SUCCESS;
    }
    else
    {
        return IV_FAIL;
    }

}